

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_pack.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Contents of the tuple:\t",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dog",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cat",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hyena",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
	//A tuple with four elements
	std::tuple <const char *, const char *,
		const char *, int> _tuple = std::make_tuple ("Dog", "Cat", "Hyena", 99);

	//C++17
	auto [a,b,c,d] = _tuple;
	std::cout << std::endl;
	std::cout << "Contents of the tuple:\t" << a << ", " << b << ", " << c
				<< ", " << d << "." << std::endl;
	std::cout << std::endl;
}